

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gd2.c
# Opt level: O1

gdImagePtr gdImageCreateFromGd2Ctx(gdIOCtxPtr in)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  gdImagePtr im;
  char *chunkBuf;
  char *compBuf;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  size_t nmemb;
  int fmt;
  int local_a0;
  int cs;
  int ncy;
  int ncx;
  t_chunk_info *chunkIdx;
  gdIOCtxPtr local_88;
  char *local_80;
  int local_74;
  int ch;
  int vers;
  int sy;
  int sx;
  long local_60;
  t_chunk_info *local_58;
  uLongf local_50;
  long local_48;
  long local_40;
  uLongf chunkLen;
  
  chunkIdx = (t_chunk_info *)0x0;
  local_88 = in;
  iVar2 = _gd2GetHeader(in,&sx,&sy,&cs,&vers,&fmt,&ncx,&ncy,&chunkIdx);
  if (iVar2 == 0) {
LAB_00115b06:
    im = (gdImagePtr)0x0;
  }
  else {
    if (fmt - 3U < 2) {
      im = gdImageCreateTrueColor(sx,sy);
    }
    else {
      im = gdImageCreate(sx,sy);
    }
    if (im == (gdImagePtr)0x0) {
LAB_00115afc:
      gdFree(chunkIdx);
      goto LAB_00115b06;
    }
    iVar2 = _gdGetColors(local_88,im,(uint)(vers == 2));
    if (iVar2 == 0) {
      gdImageDestroy(im);
      goto LAB_00115afc;
    }
  }
  iVar2 = 0;
  if (im != (gdImagePtr)0x0) {
    if ((fmt != 4) && (fmt != 2)) {
      chunkBuf = (char *)0x0;
      compBuf = (char *)0x0;
LAB_00115bae:
      if (0 < ncy) {
        local_50 = (uLongf)iVar2;
        local_58 = chunkIdx;
        iVar2 = 0;
        uVar9 = 0;
        lVar5 = 0;
        local_80 = compBuf;
        do {
          if (0 < ncx) {
            lVar5 = (long)(int)lVar5;
            local_74 = iVar2;
            iVar7 = 0;
            do {
              local_a0 = iVar7;
              iVar7 = cs * local_74;
              iVar2 = cs + iVar7;
              if (im->sy <= cs + iVar7) {
                iVar2 = im->sy;
              }
              if ((fmt == 4) || (fmt == 2)) {
                chunkLen = local_50;
                iVar3 = _gd2ReadChunk(local_58[lVar5].offset,compBuf,local_58[lVar5].size,chunkBuf,
                                      &chunkLen,local_88);
                uVar9 = 0;
                if (iVar3 == 0) goto LAB_00115e1a;
              }
              iVar3 = local_a0;
              local_48 = lVar5;
              if (iVar7 < iVar2) {
                lVar8 = (long)iVar7;
                lVar5 = (long)iVar2;
                local_60 = lVar5;
                do {
                  iVar7 = cs * iVar3;
                  iVar2 = cs + iVar7;
                  if (im->sx <= cs + iVar7) {
                    iVar2 = im->sx;
                  }
                  if ((fmt == 4) || (fmt == 2)) {
                    if (iVar7 < iVar2) {
                      lVar4 = (long)iVar7;
                      do {
                        iVar7 = (int)uVar9;
                        lVar6 = (long)iVar7;
                        uVar9 = lVar6 + 1;
                        if (im->trueColor == 0) {
                          im->pixels[lVar8][lVar4] = chunkBuf[lVar6];
                        }
                        else {
                          pbVar1 = (byte *)(chunkBuf + uVar9);
                          uVar9 = (ulong)(iVar7 + 4);
                          im->tpixels[lVar8][lVar4] =
                               (uint)(byte)chunkBuf[lVar6 + 3] |
                               (uint)(byte)chunkBuf[lVar6 + 2] << 8 |
                               (uint)*pbVar1 << 0x10 | (uint)(byte)chunkBuf[lVar6] << 0x18;
                        }
                        lVar4 = lVar4 + 1;
                      } while (lVar4 < iVar2);
                    }
                  }
                  else if (iVar7 < iVar2) {
                    lVar6 = (long)iVar7;
                    local_40 = (long)iVar2;
                    lVar4 = lVar6 * 4;
                    do {
                      if (im->trueColor == 0) {
                        iVar2 = gdGetByte(&ch,local_88);
                        if (iVar2 == 0) {
                          gd_error("gd2: EOF while reading\n");
                          iVar2 = 5;
                        }
                        else {
                          im->pixels[lVar8][lVar6] = (uchar)ch;
                          iVar2 = 0;
                        }
                        if (iVar2 != 0) {
                          compBuf = local_80;
                          if (iVar2 != 5) {
                            return im;
                          }
                          goto LAB_00115e1a;
                        }
                      }
                      else {
                        iVar2 = gdGetInt((int *)((long)im->tpixels[lVar8] + lVar4),local_88);
                        if (iVar2 == 0) {
                          gd_error("gd2: EOF while reading\n");
                          compBuf = local_80;
                          goto LAB_00115e1a;
                        }
                      }
                      lVar6 = lVar6 + 1;
                      lVar4 = lVar4 + 4;
                      lVar5 = local_60;
                      compBuf = local_80;
                      iVar3 = local_a0;
                    } while (lVar6 < local_40);
                  }
                  lVar8 = lVar8 + 1;
                } while (lVar8 < lVar5);
              }
              lVar5 = local_48 + 1;
              iVar2 = local_74;
              iVar7 = iVar3 + 1;
            } while (iVar3 + 1 < ncx);
          }
          iVar2 = iVar2 + 1;
        } while (iVar2 < ncy);
      }
      gdFree(chunkBuf);
      gdFree(compBuf);
      gdFree(chunkIdx);
      return im;
    }
    if (ncy * ncx < 1) {
      nmemb = 1;
    }
    else {
      uVar9 = 0;
      iVar2 = 0;
      do {
        if (iVar2 < chunkIdx[uVar9].size) {
          iVar2 = chunkIdx[uVar9].size;
        }
        uVar9 = uVar9 + 1;
      } while ((uint)(ncy * ncx) != uVar9);
      nmemb = (size_t)(iVar2 + 1);
    }
    iVar2 = (cs << (im->trueColor != 0) * '\x02') * cs;
    chunkBuf = (char *)gdCalloc((long)iVar2,1);
    if (chunkBuf == (char *)0x0) {
      chunkBuf = (char *)0x0;
    }
    else {
      compBuf = (char *)gdCalloc(nmemb,1);
      if (compBuf != (char *)0x0) goto LAB_00115bae;
    }
    compBuf = (char *)0x0;
LAB_00115e1a:
    gdImageDestroy(im);
    if (chunkBuf != (char *)0x0) {
      gdFree(chunkBuf);
    }
    if (compBuf != (char *)0x0) {
      gdFree(compBuf);
    }
    if (chunkIdx != (t_chunk_info *)0x0) {
      gdFree(chunkIdx);
    }
  }
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromGd2Ctx (gdIOCtxPtr in)
{
	int sx, sy;
	int i;
	int ncx, ncy, nc, cs, cx, cy;
	int x, y, ylo, yhi, xlo, xhi;
	int vers, fmt;
	t_chunk_info *chunkIdx = NULL;	/* So we can gdFree it with impunity. */
	unsigned char *chunkBuf = NULL;	/* So we can gdFree it with impunity. */
	int chunkNum = 0;
	int chunkMax = 0;
	uLongf chunkLen;
	int chunkPos = 0;
	int compMax = 0;
	int bytesPerPixel;
	char *compBuf = NULL;		/* So we can gdFree it with impunity. */

	gdImagePtr im;

	/* Get the header */
	im =
	    _gd2CreateFromFile (in, &sx, &sy, &cs, &vers, &fmt, &ncx, &ncy,
	                        &chunkIdx);
	if (im == NULL) {
		/* No need to free chunkIdx as _gd2CreateFromFile does it for us. */
		return 0;
	}

	bytesPerPixel = im->trueColor ? 4 : 1;
	nc = ncx * ncy;

	if (gd2_compressed (fmt)) {
		/* Find the maximum compressed chunk size. */
		compMax = 0;
		for (i = 0; (i < nc); i++) {
			if (chunkIdx[i].size > compMax) {
				compMax = chunkIdx[i].size;
			};
		};
		compMax++;

		/* Allocate buffers */
		chunkMax = cs * bytesPerPixel * cs;
		chunkBuf = gdCalloc (chunkMax, 1);
		if (!chunkBuf) {
			goto fail;
		}
		compBuf = gdCalloc (compMax, 1);
		if (!compBuf) {
			goto fail;
		}

		GD2_DBG (printf ("Largest compressed chunk is %d bytes\n", compMax));
	};

	/*      if ( (ncx != sx / cs) || (ncy != sy / cs)) { */
	/*              goto fail2; */
	/*      }; */

	/* Read the data... */
	for (cy = 0; (cy < ncy); cy++) {
		for (cx = 0; (cx < ncx); cx++) {

			ylo = cy * cs;
			yhi = ylo + cs;
			if (yhi > im->sy) {
				yhi = im->sy;
			};

			GD2_DBG (printf
			         ("Processing Chunk %d (%d, %d), y from %d to %d\n",
			          chunkNum, cx, cy, ylo, yhi));

			if (gd2_compressed (fmt)) {

				chunkLen = chunkMax;

				if (!_gd2ReadChunk (chunkIdx[chunkNum].offset,
				                    compBuf,
				                    chunkIdx[chunkNum].size,
				                    (char *) chunkBuf, &chunkLen, in)) {
					GD2_DBG (printf ("Error reading comproessed chunk\n"));
					goto fail;
				};

				chunkPos = 0;
			};

			for (y = ylo; (y < yhi); y++) {

				xlo = cx * cs;
				xhi = xlo + cs;
				if (xhi > im->sx) {
					xhi = im->sx;
				};
				/*GD2_DBG(printf("y=%d: ",y)); */
				if (!gd2_compressed (fmt)) {
					for (x = xlo; x < xhi; x++) {

						if (im->trueColor) {
							if (!gdGetInt (&im->tpixels[y][x], in)) {
								gd_error("gd2: EOF while reading\n");
								goto fail;
							}
						} else {
							int ch;
							if (!gdGetByte (&ch, in)) {
								gd_error("gd2: EOF while reading\n");
								goto fail;
							}
							im->pixels[y][x] = ch;
						}
					}
				} else {
					for (x = xlo; x < xhi; x++) {
						if (im->trueColor) {
							/* 2.0.1: work around a gcc bug by being verbose.
							   TBB */
							int a = chunkBuf[chunkPos++] << 24;
							int r = chunkBuf[chunkPos++] << 16;
							int g = chunkBuf[chunkPos++] << 8;
							int b = chunkBuf[chunkPos++];
							/* 2.0.11: tpixels */
							im->tpixels[y][x] = a + r + g + b;
						} else {
							im->pixels[y][x] = chunkBuf[chunkPos++];
						}
					};
				};
				/*GD2_DBG(printf("\n")); */
			};
			chunkNum++;
		};
	};

	GD2_DBG (printf ("Freeing memory\n"));

	gdFree (chunkBuf);
	gdFree (compBuf);
	gdFree (chunkIdx);

	GD2_DBG (printf ("Done\n"));

	return im;

fail:
	gdImageDestroy (im);
	if (chunkBuf) {
		gdFree (chunkBuf);
	}
	if (compBuf) {
		gdFree (compBuf);
	}
	if (chunkIdx) {
		gdFree (chunkIdx);
	}
	return 0;
}